

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_resources(CompilerGLSL *this)

{
  ExecutionModel EVar1;
  undefined8 uVar2;
  bool bVar3;
  uint32_t uVar4;
  Types TVar5;
  uint32_t uVar6;
  SPIRConstant *pSVar7;
  SPIRConstantOp *constant;
  SPIRUndef *pSVar8;
  SmallVector<unsigned_int,_8UL> *this_00;
  uint *puVar9;
  SPIRType *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  byte local_4c1;
  byte local_453;
  byte local_451;
  byte local_429;
  bool local_406;
  bool local_405;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8 [32];
  string local_3b8;
  undefined1 local_398 [8];
  string initializer_1;
  SPIRVariable *var;
  uint global;
  uint *__end1_1;
  uint *__begin1_1;
  SmallVector<unsigned_int,_8UL> *__range1_1;
  bool *local_348;
  bool *local_340;
  bool local_331;
  undefined1 auStack_330 [7];
  bool emitted_base_instance;
  bool *local_328;
  bool *local_320;
  bool local_311;
  anon_class_8_1_8991fb9c aStack_310;
  bool skip_separate_image_sampler;
  anon_class_8_1_8991fb9c local_308;
  anon_class_8_1_8991fb9c local_300;
  uint32_t local_2f4;
  uint *puStack_2f0;
  uint type_2;
  uint *__end2;
  uint *__begin2;
  SmallVector<unsigned_int,_8UL> *__range2;
  string local_2d0;
  undefined1 local_2b0 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  inputs;
  TypedID<(spirv_cross::Types)3> local_190;
  TypedID<(spirv_cross::Types)3> local_18c;
  SpecializationConstant local_188;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130 [32];
  string local_110;
  undefined1 local_f0 [8];
  string initializer;
  SPIRType *type_1;
  SPIRUndef *undef;
  byte local_b1;
  SPIRConstant *pSStack_b0;
  bool is_natural_struct;
  SPIRType *type;
  string local_a0;
  byte local_79;
  SPIRConstant *pSStack_78;
  bool needs_declaration;
  SPIRConstant *c;
  Variant *local_60;
  Variant *id;
  TypedID<(spirv_cross::Types)0> *id_;
  TypedID<(spirv_cross::Types)0> *__end1;
  TypedID<(spirv_cross::Types)0> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range1;
  LoopLock loop_lock;
  SPIRConstant *pSStack_28;
  bool emitted;
  char *storage;
  SPIREntryPoint *pSStack_18;
  bool global_invariant_position;
  SPIREntryPoint *execution;
  CompilerGLSL *this_local;
  
  execution = (SPIREntryPoint *)this;
  pSStack_18 = Compiler::get_entry_point(&this->super_Compiler);
  (*(this->super_Compiler)._vptr_Compiler[0x3d])();
  if ((pSStack_18->model == ExecutionModelFragment) && (bVar3 = is_legacy(this), bVar3)) {
    replace_fragment_outputs(this);
  }
  bVar3 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                    (&this->pls_inputs);
  if ((!bVar3) ||
     (bVar3 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                        (&this->pls_outputs), !bVar3)) {
    emit_pls(this);
  }
  if ((pSStack_18->model - ExecutionModelTessellationControl < 3) ||
     (pSStack_18->model == ExecutionModelMeshEXT)) {
    fixup_implicit_builtin_block_names(this,pSStack_18->model);
  }
  local_405 = false;
  if (((this->super_Compiler).position_invariant & 1U) != 0) {
    local_406 = true;
    if (((this->options).es & 1U) == 0) {
      local_406 = 0x77 < (this->options).version;
    }
    local_405 = local_406;
  }
  pSVar7 = (SPIRConstant *)CONCAT71((int7)((ulong)this >> 8),local_405);
  storage._7_1_ = local_405;
  if (((((this->options).separate_shader_objects & 1U) == 0) || (((this->options).es & 1U) != 0)) ||
     (pSStack_18->model == ExecutionModelFragment)) {
    bVar3 = should_force_emit_builtin_block(this,Output);
    if (bVar3) {
      emit_declared_builtin_block(this,Output,pSStack_18->model);
      storage._7_1_ = 0;
    }
    else if ((pSStack_18->geometry_passthrough & 1U) == 0) {
      pSStack_28 = (SPIRConstant *)0x59de55;
      if (pSStack_18->model == ExecutionModelFragment) {
        pSStack_28 = (SPIRConstant *)0x5ab1f1;
      }
      pSVar7 = pSStack_28;
      if ((this->super_Compiler).clip_distance_count != 0) {
        pSVar7 = (SPIRConstant *)&(this->super_Compiler).clip_distance_count;
        statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                  (this,(char **)&stack0xffffffffffffffd8,(char (*) [24])0x5b12b5,(uint *)pSVar7,
                   (char (*) [3])0x5963df);
      }
      if ((this->super_Compiler).cull_distance_count != 0) {
        pSVar7 = (SPIRConstant *)&(this->super_Compiler).cull_distance_count;
        statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                  (this,(char **)&stack0xffffffffffffffd8,(char (*) [24])0x5b12ce,(uint *)pSVar7,
                   (char (*) [3])0x5963df);
      }
      if (((this->super_Compiler).clip_distance_count != 0) ||
         ((this->super_Compiler).cull_distance_count != 0)) {
        statement<char_const(&)[1]>(this,(char (*) [1])0x563e71);
      }
    }
    else {
      emit_declared_builtin_block(this,Input,pSStack_18->model);
    }
    goto LAB_0044dad0;
  }
  EVar1 = pSStack_18->model;
  if (EVar1 != ExecutionModelVertex) {
    if (EVar1 - ExecutionModelTessellationControl < 3) {
      emit_declared_builtin_block(this,Input,pSStack_18->model);
      emit_declared_builtin_block(this,Output,pSStack_18->model);
      storage._7_1_ = 0;
      goto LAB_0044dad0;
    }
    if (EVar1 != ExecutionModelMeshEXT) goto LAB_0044dad0;
  }
  emit_declared_builtin_block(this,Output,pSStack_18->model);
  storage._7_1_ = 0;
LAB_0044dad0:
  if ((storage._7_1_ & 1) != 0) {
    statement<char_const(&)[23]>(this,(char (*) [23])"invariant gl_Position;");
    statement<char_const(&)[1]>(this,(char (*) [1])0x563e71);
  }
  loop_lock.lock._7_1_ = 0;
  ParsedIR::create_loop_hard_lock((ParsedIR *)&__range1);
  __begin1 = (TypedID<(spirv_cross::Types)0> *)
             &(this->super_Compiler).ir.ids_for_constant_undef_or_type;
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  id_ = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                  ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  for (; __end1 != id_; __end1 = __end1 + 1) {
    id = (Variant *)__end1;
    pSVar7 = (SPIRConstant *)__end1;
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    local_60 = VectorView<spirv_cross::Variant>::operator[]
                         (&(this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>,
                          (ulong)uVar4);
    TVar5 = Variant::get_type(local_60);
    if (TVar5 == TypeConstant) {
      pSVar7 = Variant::get<spirv_cross::SPIRConstant>(local_60);
      local_429 = 1;
      if ((pSVar7->specialization & 1U) == 0) {
        local_429 = pSVar7->is_used_as_lut;
      }
      local_79 = local_429 & 1;
      pSStack_78 = pSVar7;
      if (local_79 != 0) {
        if ((((this->options).vulkan_semantics & 1U) == 0) && ((pSVar7->specialization & 1U) != 0))
        {
          uVar4 = Compiler::get_decoration
                            (&this->super_Compiler,(ID)(pSVar7->super_IVariant).self.id,
                             DecorationSpecId);
          constant_value_macro_name_abi_cxx11_(&local_a0,this,uVar4);
          ::std::__cxx11::string::operator=
                    ((string *)&pSStack_78->specialization_constant_macro_name,(string *)&local_a0);
          ::std::__cxx11::string::~string((string *)&local_a0);
        }
        emit_constant(this,pSStack_78);
        loop_lock.lock._7_1_ = 1;
      }
    }
    else {
      TVar5 = Variant::get_type(local_60);
      if (TVar5 == TypeConstantOp) {
        constant = Variant::get<spirv_cross::SPIRConstantOp>(local_60);
        emit_specialization_constant_op(this,constant);
        loop_lock.lock._7_1_ = 1;
      }
      else {
        TVar5 = Variant::get_type(local_60);
        if (TVar5 == TypeType) {
          pSStack_b0 = (SPIRConstant *)Variant::get<spirv_cross::SPIRType>(local_60);
          local_451 = 0;
          pSVar7 = pSStack_b0;
          if ((pSStack_b0->m).c[0].r[0].u32 == 0xf) {
            bVar3 = VectorView<unsigned_int>::empty
                              ((VectorView<unsigned_int> *)((pSStack_b0->m).c[0].r + 2));
            pSVar7 = (SPIRConstant *)CONCAT71((int7)((ulong)pSVar7 >> 8),bVar3);
            local_451 = 0;
            if ((bVar3) &&
               (local_451 = 0, pSVar7 = pSStack_b0, ((pSStack_b0->m).c[1].field_0x34 & 1) == 0)) {
              bVar3 = Compiler::has_decoration
                                (&this->super_Compiler,(ID)(pSStack_b0->super_IVariant).self.id,
                                 Block);
              pSVar7 = (SPIRConstant *)CONCAT71((int7)((ulong)pSVar7 >> 8),bVar3);
              local_453 = 0;
              if (!bVar3) {
                bVar3 = Compiler::has_decoration
                                  (&this->super_Compiler,(ID)(pSStack_b0->super_IVariant).self.id,
                                   BufferBlock);
                local_453 = bVar3 ^ 0xff;
              }
              local_451 = local_453;
            }
          }
          local_b1 = local_451 & 1;
          if (((((pSStack_b0->m).c[0].r[0].u32 == 0xf) &&
               (((pSStack_b0->m).c[1].field_0x34 & 1) != 0)) &&
              (bVar3 = Compiler::has_decoration
                                 (&this->super_Compiler,(ID)(pSStack_b0->super_IVariant).self.id,
                                  Block), bVar3)) &&
             ((((pSStack_b0->m).c[2].r[2].u32 == 0x14da || ((pSStack_b0->m).c[2].r[2].u32 == 0x14de)
               ) || ((pSStack_b0->m).c[2].r[2].u32 == 0x14db)))) {
            uVar4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)((long)&(pSStack_b0->subconstants).buffer_capacity + 4));
            pSStack_b0 = (SPIRConstant *)
                         Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar4);
            local_b1 = 1;
          }
          if (local_b1 != 0) {
            if ((loop_lock.lock._7_1_ & 1) != 0) {
              statement<char_const(&)[1]>(this,(char (*) [1])0x563e71);
            }
            loop_lock.lock._7_1_ = 0;
            emit_struct(this,(SPIRType *)pSStack_b0);
          }
        }
        else {
          TVar5 = Variant::get_type(local_60);
          if (TVar5 == TypeUndef) {
            pSVar8 = Variant::get<spirv_cross::SPIRUndef>(local_60);
            uVar4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar8->super_IVariant).field_0xc);
            initializer.field_2._8_8_ =
                 Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar4);
            if ((((SPIRType *)initializer.field_2._8_8_)->basetype != Void) &&
               (bVar3 = Compiler::type_is_top_level_block
                                  (&this->super_Compiler,(SPIRType *)initializer.field_2._8_8_),
               !bVar3)) {
              ::std::__cxx11::string::string((string *)local_f0);
              if ((((this->options).force_zero_initialized_variables & 1U) != 0) &&
                 (bVar3 = type_can_zero_initialize(this,(SPIRType *)initializer.field_2._8_8_),
                 bVar3)) {
                uVar4 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSVar8->super_IVariant).field_0xc);
                (*(this->super_Compiler)._vptr_Compiler[0x3b])(local_130,this,(ulong)uVar4);
                join<char_const(&)[4],std::__cxx11::string>
                          (&local_110,(spirv_cross *)0x5abcd8,(char (*) [4])local_130,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pSVar7);
                ::std::__cxx11::string::operator=((string *)local_f0,(string *)&local_110);
                ::std::__cxx11::string::~string((string *)&local_110);
                ::std::__cxx11::string::~string(local_130);
              }
              uVar2 = initializer.field_2._8_8_;
              uVar4 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(pSVar8->super_IVariant).self);
              (*(this->super_Compiler)._vptr_Compiler[6])(&wg_x,this,(ulong)uVar4,1);
              uVar4 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(pSVar8->super_IVariant).self);
              (*(this->super_Compiler)._vptr_Compiler[0x1b])
                        (&local_150,this,uVar2,&wg_x,(ulong)uVar4);
              pSVar7 = (SPIRConstant *)0x5abb6c;
              statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                        (this,&local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,(char (*) [2])0x5abb6c);
              ::std::__cxx11::string::~string((string *)&local_150);
              ::std::__cxx11::string::~string((string *)&wg_x);
              loop_lock.lock._7_1_ = 1;
              ::std::__cxx11::string::~string((string *)local_f0);
            }
          }
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&__range1);
  if ((loop_lock.lock._7_1_ & 1) != 0) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x563e71);
  }
  if (((pSStack_18->model == ExecutionModelGLCompute) &&
      (((this->options).vulkan_semantics & 1U) == 0)) &&
     (((pSStack_18->workgroup_size).constant != 0 ||
      (bVar3 = Bitset::get(&pSStack_18->flags,0x26), bVar3)))) {
    SpecializationConstant::SpecializationConstant(&wg_y);
    SpecializationConstant::SpecializationConstant(&wg_z);
    SpecializationConstant::SpecializationConstant(&local_188);
    Compiler::get_work_group_size_specialization_constants
              (&this->super_Compiler,&wg_y,&wg_z,&local_188);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_y);
    TypedID<(spirv_cross::Types)3>::TypedID(&local_18c,0);
    uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_18c);
    pSVar7 = (SPIRConstant *)(ulong)uVar4;
    bVar3 = true;
    if (uVar4 == uVar6) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_z);
      TypedID<(spirv_cross::Types)3>::TypedID(&local_190,0);
      uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_190);
      pSVar7 = (SPIRConstant *)(ulong)uVar4;
      bVar3 = true;
      if (uVar4 == uVar6) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_188);
        TypedID<(spirv_cross::Types)3>::TypedID
                  ((TypedID<(spirv_cross::Types)3> *)(inputs.stack_storage.aligned_char + 0xfc),0);
        uVar6 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)(inputs.stack_storage.aligned_char + 0xfc));
        pSVar7 = (SPIRConstant *)(ulong)uVar6;
        bVar3 = uVar4 != uVar6;
      }
    }
    if (bVar3) {
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_2b0);
      build_workgroup_size
                (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2b0,&wg_y,&wg_z,&local_188);
      merge(&local_2d0,
            (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
             *)local_2b0,", ");
      pSVar7 = (SPIRConstant *)0x5af81d;
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
                (this,(char (*) [8])"layout(",&local_2d0,(char (*) [6])0x5af81d);
      ::std::__cxx11::string::~string((string *)&local_2d0);
      statement<char_const(&)[1]>(this,(char (*) [1])0x563e71);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_2b0);
    }
  }
  loop_lock.lock._7_1_ = 0;
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    __range2 = (SmallVector<unsigned_int,_8UL> *)this;
    ParsedIR::
    for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerGLSL::emit_resources()::__0>
              (&(this->super_Compiler).ir,(anon_class_8_1_8991fb9c *)&__range2);
    __begin2 = (uint *)&(this->super_Compiler).physical_storage_non_block_pointer_types;
    __end2 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin2);
    puStack_2f0 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin2);
    for (; __end2 != puStack_2f0; __end2 = __end2 + 1) {
      local_2f4 = *__end2;
      emit_buffer_reference_block(this,local_2f4,false);
    }
    local_300.this = this;
    ParsedIR::
    for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerGLSL::emit_resources()::__1>
              (&(this->super_Compiler).ir,&local_300);
  }
  local_308.this = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::emit_resources()::__2>
            (&(this->super_Compiler).ir,&local_308);
  aStack_310.this = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::emit_resources()::__3>
            (&(this->super_Compiler).ir,&stack0xfffffffffffffcf0);
  bVar3 = VectorView<spirv_cross::CombinedImageSampler>::empty
                    (&(this->super_Compiler).combined_image_samplers.
                      super_VectorView<spirv_cross::CombinedImageSampler>);
  local_4c1 = 1;
  if (bVar3) {
    local_4c1 = (this->options).vulkan_semantics ^ 0xff;
  }
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71((int7)((ulong)pSVar7 >> 8),local_4c1) & 0xffffffffffffff01);
  local_311 = SUB81(ts_1,0);
  local_328 = &local_311;
  local_320 = (bool *)((long)&loop_lock.lock + 7);
  _auStack_330 = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::emit_resources()::__4>
            (&(this->super_Compiler).ir,(anon_class_24_3_cd3e9deb *)auStack_330);
  if ((loop_lock.lock._7_1_ & 1) != 0) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x563e71);
  }
  loop_lock.lock._7_1_ = 0;
  local_331 = false;
  local_348 = (bool *)((long)&loop_lock.lock + 7);
  local_340 = &local_331;
  __range1_1 = (SmallVector<unsigned_int,_8UL> *)this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::emit_resources()::__5>
            (&(this->super_Compiler).ir,(anon_class_24_3_84543f17 *)&__range1_1);
  this_00 = &(this->super_Compiler).global_variables;
  __end1_1 = VectorView<unsigned_int>::begin(&this_00->super_VectorView<unsigned_int>);
  puVar9 = VectorView<unsigned_int>::end(&this_00->super_VectorView<unsigned_int>);
  for (; __end1_1 != puVar9; __end1_1 = __end1_1 + 1) {
    initializer_1.field_2._8_8_ =
         Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,*__end1_1);
    bVar3 = Compiler::is_hidden_variable
                      (&this->super_Compiler,(SPIRVariable *)initializer_1.field_2._8_8_,true);
    if (!bVar3) {
      if (*(int *)(initializer_1.field_2._8_8_ + 0x10) == 3) {
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)(initializer_1.field_2._8_8_ + 0x18));
        if (uVar4 != 0) {
          uVar4 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)(initializer_1.field_2._8_8_ + 0x18));
          pSVar7 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar4);
          if (pSVar7 != (SPIRConstant *)0x0) {
            emit_output_variable_initializer(this,(SPIRVariable *)initializer_1.field_2._8_8_);
          }
        }
      }
      else {
        bVar3 = variable_is_lut(this,(SPIRVariable *)initializer_1.field_2._8_8_);
        if (!bVar3) {
          uVar4 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)(initializer_1.field_2._8_8_ + 8));
          add_resource_name(this,uVar4);
          ::std::__cxx11::string::string((string *)local_398);
          if ((((((this->options).force_zero_initialized_variables & 1U) != 0) &&
               (*(int *)(initializer_1.field_2._8_8_ + 0x10) == 6)) &&
              (uVar4 = TypedID::operator_cast_to_unsigned_int
                                 ((TypedID *)(initializer_1.field_2._8_8_ + 0x18)), uVar4 == 0)) &&
             (uVar4 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)(initializer_1.field_2._8_8_ + 0x5c)), uVar4 == 0)) {
            type_00 = Compiler::get_variable_data_type
                                (&this->super_Compiler,(SPIRVariable *)initializer_1.field_2._8_8_);
            bVar3 = type_can_zero_initialize(this,type_00);
            if (bVar3) {
              uVar4 = Compiler::get_variable_data_type_id
                                (&this->super_Compiler,(SPIRVariable *)initializer_1.field_2._8_8_);
              (*(this->super_Compiler)._vptr_Compiler[0x3b])(local_3d8,this,(ulong)uVar4);
              join<char_const(&)[4],std::__cxx11::string>
                        (&local_3b8,(spirv_cross *)0x5abcd8,(char (*) [4])local_3d8,ts_1);
              ::std::__cxx11::string::operator=((string *)local_398,(string *)&local_3b8);
              ::std::__cxx11::string::~string((string *)&local_3b8);
              ::std::__cxx11::string::~string(local_3d8);
            }
          }
          (*(this->super_Compiler)._vptr_Compiler[0x28])
                    (&local_3f8,this,initializer_1.field_2._8_8_);
          ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5abb6c;
          statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    (this,&local_3f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     (char (*) [2])0x5abb6c);
          ::std::__cxx11::string::~string((string *)&local_3f8);
          loop_lock.lock._7_1_ = 1;
          ::std::__cxx11::string::~string((string *)local_398);
        }
      }
    }
  }
  if ((loop_lock.lock._7_1_ & 1) != 0) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x563e71);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_resources()
{
	auto &execution = get_entry_point();

	replace_illegal_names();

	// Legacy GL uses gl_FragData[], redeclare all fragment outputs
	// with builtins.
	if (execution.model == ExecutionModelFragment && is_legacy())
		replace_fragment_outputs();

	// Emit PLS blocks if we have such variables.
	if (!pls_inputs.empty() || !pls_outputs.empty())
		emit_pls();

	switch (execution.model)
	{
	case ExecutionModelGeometry:
	case ExecutionModelTessellationControl:
	case ExecutionModelTessellationEvaluation:
	case ExecutionModelMeshEXT:
		fixup_implicit_builtin_block_names(execution.model);
		break;

	default:
		break;
	}

	bool global_invariant_position = position_invariant && (options.es || options.version >= 120);

	// Emit custom gl_PerVertex for SSO compatibility.
	if (options.separate_shader_objects && !options.es && execution.model != ExecutionModelFragment)
	{
		switch (execution.model)
		{
		case ExecutionModelGeometry:
		case ExecutionModelTessellationControl:
		case ExecutionModelTessellationEvaluation:
			emit_declared_builtin_block(StorageClassInput, execution.model);
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			global_invariant_position = false;
			break;

		case ExecutionModelVertex:
		case ExecutionModelMeshEXT:
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			global_invariant_position = false;
			break;

		default:
			break;
		}
	}
	else if (should_force_emit_builtin_block(StorageClassOutput))
	{
		emit_declared_builtin_block(StorageClassOutput, execution.model);
		global_invariant_position = false;
	}
	else if (execution.geometry_passthrough)
	{
		// Need to declare gl_in with Passthrough.
		// If we're doing passthrough, we cannot emit an output block, so the output block test above will never pass.
		emit_declared_builtin_block(StorageClassInput, execution.model);
	}
	else
	{
		// Need to redeclare clip/cull distance with explicit size to use them.
		// SPIR-V mandates these builtins have a size declared.
		const char *storage = execution.model == ExecutionModelFragment ? "in" : "out";
		if (clip_distance_count != 0)
			statement(storage, " float gl_ClipDistance[", clip_distance_count, "];");
		if (cull_distance_count != 0)
			statement(storage, " float gl_CullDistance[", cull_distance_count, "];");
		if (clip_distance_count != 0 || cull_distance_count != 0)
			statement("");
	}

	if (global_invariant_position)
	{
		statement("invariant gl_Position;");
		statement("");
	}

	bool emitted = false;

	// If emitted Vulkan GLSL,
	// emit specialization constants as actual floats,
	// spec op expressions will redirect to the constant name.
	//
	{
		auto loop_lock = ir.create_loop_hard_lock();
		for (auto &id_ : ir.ids_for_constant_undef_or_type)
		{
			auto &id = ir.ids[id_];

			// Skip declaring any bogus constants or undefs which use block types.
			// We don't declare block types directly, so this will never work.
			// Should not be legal SPIR-V, so this is considered a workaround.

			if (id.get_type() == TypeConstant)
			{
				auto &c = id.get<SPIRConstant>();

				bool needs_declaration = c.specialization || c.is_used_as_lut;

				if (needs_declaration)
				{
					if (!options.vulkan_semantics && c.specialization)
					{
						c.specialization_constant_macro_name =
						    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));
					}
					emit_constant(c);
					emitted = true;
				}
			}
			else if (id.get_type() == TypeConstantOp)
			{
				emit_specialization_constant_op(id.get<SPIRConstantOp>());
				emitted = true;
			}
			else if (id.get_type() == TypeType)
			{
				auto *type = &id.get<SPIRType>();

				bool is_natural_struct = type->basetype == SPIRType::Struct && type->array.empty() && !type->pointer &&
				                         (!has_decoration(type->self, DecorationBlock) &&
				                          !has_decoration(type->self, DecorationBufferBlock));

				// Special case, ray payload and hit attribute blocks are not really blocks, just regular structs.
				if (type->basetype == SPIRType::Struct && type->pointer &&
				    has_decoration(type->self, DecorationBlock) &&
				    (type->storage == StorageClassRayPayloadKHR || type->storage == StorageClassIncomingRayPayloadKHR ||
				     type->storage == StorageClassHitAttributeKHR))
				{
					type = &get<SPIRType>(type->parent_type);
					is_natural_struct = true;
				}

				if (is_natural_struct)
				{
					if (emitted)
						statement("");
					emitted = false;

					emit_struct(*type);
				}
			}
			else if (id.get_type() == TypeUndef)
			{
				auto &undef = id.get<SPIRUndef>();
				auto &type = this->get<SPIRType>(undef.basetype);
				// OpUndef can be void for some reason ...
				if (type.basetype == SPIRType::Void)
					continue;

				// This will break. It is bogus and should not be legal.
				if (type_is_top_level_block(type))
					continue;

				string initializer;
				if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
					initializer = join(" = ", to_zero_initialized_expression(undef.basetype));

				// FIXME: If used in a constant, we must declare it as one.
				statement(variable_decl(type, to_name(undef.self), undef.self), initializer, ";");
				emitted = true;
			}
		}
	}

	if (emitted)
		statement("");

	// If we needed to declare work group size late, check here.
	// If the work group size depends on a specialization constant, we need to declare the layout() block
	// after constants (and their macros) have been declared.
	if (execution.model == ExecutionModelGLCompute && !options.vulkan_semantics &&
	    (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId)))
	{
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		if ((wg_x.id != ConstantID(0)) || (wg_y.id != ConstantID(0)) || (wg_z.id != ConstantID(0)))
		{
			SmallVector<string> inputs;
			build_workgroup_size(inputs, wg_x, wg_y, wg_z);
			statement("layout(", merge(inputs), ") in;");
			statement("");
		}
	}

	emitted = false;

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		// Output buffer reference blocks.
		// Do this in two stages, one with forward declaration,
		// and one without. Buffer reference blocks can reference themselves
		// to support things like linked lists.
		ir.for_each_typed_id<SPIRType>([&](uint32_t id, SPIRType &type) {
			if (is_physical_pointer(type))
			{
				bool emit_type = true;
				if (!is_physical_pointer_to_buffer_block(type))
				{
					// Only forward-declare if we intend to emit it in the non_block_pointer types.
					// Otherwise, these are just "benign" pointer types that exist as a result of access chains.
					emit_type = std::find(physical_storage_non_block_pointer_types.begin(),
					                      physical_storage_non_block_pointer_types.end(),
					                      id) != physical_storage_non_block_pointer_types.end();
				}

				if (emit_type)
					emit_buffer_reference_block(id, true);
			}
		});

		for (auto type : physical_storage_non_block_pointer_types)
			emit_buffer_reference_block(type, false);

		ir.for_each_typed_id<SPIRType>([&](uint32_t id, SPIRType &type) {
			if (is_physical_pointer_to_buffer_block(type))
				emit_buffer_reference_block(id, false);
		});
	}

	// Output UBOs and SSBOs
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_block_storage = type.storage == StorageClassStorageBuffer || type.storage == StorageClassUniform ||
		                        type.storage == StorageClassShaderRecordBufferKHR;
		bool has_block_flags = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
		                       ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

		if (var.storage != StorageClassFunction && type.pointer && is_block_storage && !is_hidden_variable(var) &&
		    has_block_flags)
		{
			emit_buffer_block(var);
		}
	});

	// Output push constant blocks
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if (var.storage != StorageClassFunction && type.pointer && type.storage == StorageClassPushConstant &&
		    !is_hidden_variable(var))
		{
			emit_push_constant_block(var);
		}
	});

	bool skip_separate_image_sampler = !combined_image_samplers.empty() || !options.vulkan_semantics;

	// Output Uniform Constants (values, samplers, images, etc).
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// If we're remapping separate samplers and images, only emit the combined samplers.
		if (skip_separate_image_sampler)
		{
			// Sampler buffers are always used without a sampler, and they will also work in regular GL.
			bool sampler_buffer = type.basetype == SPIRType::Image && type.image.dim == DimBuffer;
			bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
			bool separate_sampler = type.basetype == SPIRType::Sampler;
			if (!sampler_buffer && (separate_image || separate_sampler))
				return;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (type.storage == StorageClassUniformConstant || type.storage == StorageClassAtomicCounter ||
		     type.storage == StorageClassRayPayloadKHR || type.storage == StorageClassIncomingRayPayloadKHR ||
		     type.storage == StorageClassCallableDataKHR || type.storage == StorageClassIncomingCallableDataKHR ||
		     type.storage == StorageClassHitAttributeKHR) &&
		    !is_hidden_variable(var))
		{
			emit_uniform(var);
			emitted = true;
		}
	});

	if (emitted)
		statement("");
	emitted = false;

	bool emitted_base_instance = false;

	// Output in/out interfaces.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_hidden = is_hidden_variable(var);

		// Unused output I/O variables might still be required to implement framebuffer fetch.
		if (var.storage == StorageClassOutput && !is_legacy() &&
		    location_is_framebuffer_fetch(get_decoration(var.self, DecorationLocation)) != 0)
		{
			is_hidden = false;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    interface_variable_exists_in_entry_point(var.self) && !is_hidden)
		{
			if (options.es && get_execution_model() == ExecutionModelVertex && var.storage == StorageClassInput &&
			    type.array.size() == 1)
			{
				SPIRV_CROSS_THROW("OpenGL ES doesn't support array input variables in vertex shader.");
			}
			emit_interface_block(var);
			emitted = true;
		}
		else if (is_builtin_variable(var))
		{
			auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
			// For gl_InstanceIndex emulation on GLES, the API user needs to
			// supply this uniform.

			// The draw parameter extension is soft-enabled on GL with some fallbacks.
			if (!options.vulkan_semantics)
			{
				if (!emitted_base_instance &&
				    ((options.vertex.support_nonzero_base_instance && builtin == BuiltInInstanceIndex) ||
				     (builtin == BuiltInBaseInstance)))
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseInstance;");
					statement("#endif");
					emitted = true;
					emitted_base_instance = true;
				}
				else if (builtin == BuiltInBaseVertex)
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseVertex;");
					statement("#endif");
				}
				else if (builtin == BuiltInDrawIndex)
				{
					statement("#ifndef GL_ARB_shader_draw_parameters");
					// Cannot really be worked around.
					statement("#error GL_ARB_shader_draw_parameters is not supported.");
					statement("#endif");
				}
			}
		}
	});

	// Global variables.
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (is_hidden_variable(var, true))
			continue;

		if (var.storage != StorageClassOutput)
		{
			if (!variable_is_lut(var))
			{
				add_resource_name(var.self);

				string initializer;
				if (options.force_zero_initialized_variables && var.storage == StorageClassPrivate &&
				    !var.initializer && !var.static_expression && type_can_zero_initialize(get_variable_data_type(var)))
				{
					initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(var)));
				}

				statement(variable_decl(var), initializer, ";");
				emitted = true;
			}
		}
		else if (var.initializer && maybe_get<SPIRConstant>(var.initializer) != nullptr)
		{
			emit_output_variable_initializer(var);
		}
	}

	if (emitted)
		statement("");
}